

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorPoolDatabase::FindAllExtensionNumbers
          (DescriptorPoolDatabase *this,string *extendee_type,
          vector<int,_std::allocator<int>_> *output)

{
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *this_00;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *pvVar1;
  reference ppFVar2;
  vector<int,_std::allocator<int>_> *in_RDX;
  DescriptorPool *in_RDI;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *unaff_retaddr;
  Descriptor *in_stack_00000008;
  DescriptorPool *in_stack_00000010;
  int i;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  extensions;
  Descriptor *extendee;
  value_type_conflict *in_stack_ffffffffffffff78;
  vector<int,_std::allocator<int>_> *this_01;
  string *in_stack_ffffffffffffff98;
  int local_50;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_40;
  Descriptor *local_28;
  vector<int,_std::allocator<int>_> *local_20;
  byte local_1;
  
  local_20 = in_RDX;
  local_28 = DescriptorPool::FindMessageTypeByName(in_RDI,in_stack_ffffffffffffff98);
  if (local_28 == (Descriptor *)0x0) {
    local_1 = 0;
  }
  else {
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)0x6b5107);
    DescriptorPool::FindAllExtensions(in_stack_00000010,in_stack_00000008,unaff_retaddr);
    local_50 = 0;
    while( true ) {
      this_00 = (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)(long)local_50;
      pvVar1 = (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *)std::
                  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ::size(&local_40);
      if (pvVar1 <= this_00) break;
      this_01 = local_20;
      ppFVar2 = std::
                vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::operator[](&local_40,(long)local_50);
      FieldDescriptor::number(*ppFVar2);
      std::vector<int,_std::allocator<int>_>::push_back(this_01,in_stack_ffffffffffffff78);
      local_50 = local_50 + 1;
    }
    local_1 = 1;
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::~vector(this_00);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool DescriptorPoolDatabase::FindAllExtensionNumbers(
    const std::string& extendee_type, std::vector<int>* output) {
  const Descriptor* extendee = pool_.FindMessageTypeByName(extendee_type);
  if (extendee == NULL) return false;

  std::vector<const FieldDescriptor*> extensions;
  pool_.FindAllExtensions(extendee, &extensions);

  for (int i = 0; i < extensions.size(); ++i) {
    output->push_back(extensions[i]->number());
  }

  return true;
}